

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O2

void __thiscall
duckdb::SQLLogicTestLogger::UnexpectedStatement
          (SQLLogicTestLogger *this,bool expect_ok,MaterializedQueryResult *result)

{
  char *pcVar1;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  pcVar1 = "Query unexpectedly succeeded!";
  if ((int)CONCAT71(in_register_00000031,expect_ok) != 0) {
    pcVar1 = "Query unexpectedly failed!";
  }
  std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
  PrintErrorHeader(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  PrintLineSep();
  PrintSQL(this);
  PrintLineSep();
  duckdb::QueryResult::Print();
  return;
}

Assistant:

void SQLLogicTestLogger::UnexpectedStatement(bool expect_ok, MaterializedQueryResult &result) {
	PrintErrorHeader(!expect_ok ? "Query unexpectedly succeeded!" : "Query unexpectedly failed!");
	PrintLineSep();
	PrintSQL();
	PrintLineSep();
	result.Print();
}